

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

void __thiscall Shell::buildSpectestModule(Shell *this)

{
  variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>> *this_00;
  variant<wasm::Name,_wasm::HeapType> value;
  variant<wasm::Name,_wasm::HeapType> value_00;
  variant<wasm::Name,_wasm::HeapType> value_01;
  variant<wasm::Name,_wasm::HeapType> value_02;
  variant<wasm::Name,_wasm::HeapType> value_03;
  variant<wasm::Name,_wasm::HeapType> value_04;
  variant<wasm::Name,_wasm::HeapType> value_05;
  element_type *peVar1;
  Const *pCVar2;
  Name *pNVar3;
  Err *pEVar4;
  Name NVar5;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  undefined1 local_3b8 [8];
  Result<wasm::Ok> registered;
  Register registration;
  Result<wasm::Ok> added;
  WASTModule mod;
  undefined8 uStack_320;
  undefined8 local_318;
  string_view local_310;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_300;
  Type local_2f8;
  bool local_2f0 [8];
  Address local_2e8;
  string_view local_2e0;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_2d0;
  Name *local_2c8;
  Memory *memory;
  char *local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  string_view local_298;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_288;
  Type local_280;
  Address local_278;
  Address local_270;
  HeapType local_268;
  Address local_260;
  string_view local_258;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_248;
  string_view local_240;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  string_view local_218;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_208;
  Type local_200;
  Address local_1f8;
  Address local_1f0;
  HeapType local_1e8;
  Address local_1e0;
  string_view local_1d8;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_1c8;
  string_view local_1c0;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  string_view local_198;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_188;
  string_view local_180;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  string_view local_158;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_148;
  string_view local_140;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  string_view local_118;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_108;
  string_view local_100;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  string_view local_d8;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_c8;
  Type local_c0;
  string_view local_b8;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_a8;
  Type local_a0;
  string_view local_98;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_88;
  Type local_80;
  string_view local_78;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_68;
  Type local_60;
  string_view local_58;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_48;
  Builder local_40;
  Builder builder;
  FeatureSet local_24;
  undefined1 local_20 [8];
  shared_ptr<wasm::Module> spectest;
  Shell *this_local;
  
  spectest.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::make_shared<wasm::Module>();
  ::wasm::FeatureSet::FeatureSet(&local_24,0x3fffff);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  (peVar1->features).features = local_24.features;
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_20);
  ::wasm::Builder::Builder(&local_40,peVar1);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  local_58 = (string_view)::wasm::Name::fromInt(0);
  ::wasm::Type::Type(&local_60,i32);
  pCVar2 = ::wasm::Builder::makeConst<unsigned_int>(&local_40,0x29a);
  NVar5.super_IString.str._M_str = (char *)local_58._M_len;
  NVar5.super_IString.str._M_len = (size_t)&local_48;
  ::wasm::Builder::makeGlobal
            (NVar5,(Type)local_58._M_str,(Expression *)local_60.id,(Mutability)pCVar2);
  ::wasm::Module::addGlobal((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_48);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  local_78 = (string_view)::wasm::Name::fromInt(1);
  ::wasm::Type::Type(&local_80,i64);
  pCVar2 = ::wasm::Builder::makeConst<unsigned_long>(&local_40,0x29a);
  name.super_IString.str._M_str = (char *)local_78._M_len;
  name.super_IString.str._M_len = (size_t)&local_68;
  ::wasm::Builder::makeGlobal
            (name,(Type)local_78._M_str,(Expression *)local_80.id,(Mutability)pCVar2);
  ::wasm::Module::addGlobal((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_68);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  local_98 = (string_view)::wasm::Name::fromInt(2);
  ::wasm::Type::Type(&local_a0,f32);
  pCVar2 = ::wasm::Builder::makeConst<float>(&local_40,666.6);
  name_00.super_IString.str._M_str = (char *)local_98._M_len;
  name_00.super_IString.str._M_len = (size_t)&local_88;
  ::wasm::Builder::makeGlobal
            (name_00,(Type)local_98._M_str,(Expression *)local_a0.id,(Mutability)pCVar2);
  ::wasm::Module::addGlobal((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_88);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  local_b8 = (string_view)::wasm::Name::fromInt(3);
  ::wasm::Type::Type(&local_c0,f64);
  pCVar2 = ::wasm::Builder::makeConst<double>(&local_40,666.6);
  name_01.super_IString.str._M_str = (char *)local_b8._M_len;
  name_01.super_IString.str._M_len = (size_t)&local_a8;
  ::wasm::Builder::makeGlobal
            (name_01,(Type)local_b8._M_str,(Expression *)local_c0.id,(Mutability)pCVar2);
  ::wasm::Module::addGlobal((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_a8);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  ::wasm::Name::Name((Name *)&local_d8,"global_i32");
  local_100 = (string_view)::wasm::Name::fromInt(0);
  std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)&local_f0,(Name *)&local_100);
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_e8;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_len = local_f0;
  value.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_e0;
  ::wasm::Builder::makeExport((Builder *)&local_c8,(Name)local_d8,value,Global);
  ::wasm::Module::addExport((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_c8);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  ::wasm::Name::Name((Name *)&local_118,"global_i64");
  local_140 = (string_view)::wasm::Name::fromInt(1);
  std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)&local_130,(Name *)&local_140);
  value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_128;
  value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_len = local_130;
  value_00.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_120;
  ::wasm::Builder::makeExport((Builder *)&local_108,(Name)local_118,value_00,Global);
  ::wasm::Module::addExport((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_108);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  ::wasm::Name::Name((Name *)&local_158,"global_f32");
  local_180 = (string_view)::wasm::Name::fromInt(2);
  std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)&local_170,(Name *)&local_180);
  value_01.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_168;
  value_01.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_len = local_170;
  value_01.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_160;
  ::wasm::Builder::makeExport((Builder *)&local_148,(Name)local_158,value_01,Global);
  ::wasm::Module::addExport((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_148);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  ::wasm::Name::Name((Name *)&local_198,"global_f64");
  local_1c0 = (string_view)::wasm::Name::fromInt(3);
  std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)&local_1b0,(Name *)&local_1c0);
  value_02.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_1a8;
  value_02.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_len = local_1b0;
  value_02.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_1a0;
  ::wasm::Builder::makeExport((Builder *)&local_188,(Name)local_198,value_02,Global);
  ::wasm::Module::addExport((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_188);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  local_1d8 = (string_view)::wasm::Name::fromInt(0);
  ::wasm::HeapType::HeapType(&local_1e8,func);
  ::wasm::Type::Type((Type *)&local_1e0,local_1e8,Nullable,Inexact);
  ::wasm::Address::Address(&local_1f0,10);
  ::wasm::Address::Address(&local_1f8,0x14);
  ::wasm::Type::Type(&local_200,i32);
  name_02.super_IString.str._M_str = (char *)local_1d8._M_len;
  name_02.super_IString.str._M_len = (size_t)&local_1c8;
  ::wasm::Builder::makeTable
            (name_02,(Type)local_1d8._M_str,local_1e0,local_1f0,(Type)local_1f8.addr);
  ::wasm::Module::addTable((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_1c8);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  ::wasm::Name::Name((Name *)&local_218,"table");
  local_240 = (string_view)::wasm::Name::fromInt(0);
  std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)&local_230,(Name *)&local_240);
  value_03.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_228;
  value_03.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_len = local_230;
  value_03.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_220;
  ::wasm::Builder::makeExport((Builder *)&local_208,(Name)local_218,value_03,Table);
  ::wasm::Module::addExport((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_208);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  local_258 = (string_view)::wasm::Name::fromInt(1);
  ::wasm::HeapType::HeapType(&local_268,func);
  ::wasm::Type::Type((Type *)&local_260,local_268,Nullable,Inexact);
  ::wasm::Address::Address(&local_270,10);
  ::wasm::Address::Address(&local_278,0x14);
  ::wasm::Type::Type(&local_280,i64);
  name_03.super_IString.str._M_str = (char *)local_258._M_len;
  name_03.super_IString.str._M_len = (size_t)&local_248;
  ::wasm::Builder::makeTable
            (name_03,(Type)local_258._M_str,local_260,local_270,(Type)local_278.addr);
  ::wasm::Module::addTable((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_248);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  ::wasm::Name::Name((Name *)&local_298,"table64");
  NVar5 = ::wasm::Name::fromInt(1);
  local_2b8 = NVar5.super_IString.str._M_str;
  memory = NVar5.super_IString.str._M_len;
  std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)&local_2b0,(Name *)&memory);
  value_04.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_2a8;
  value_04.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_len = local_2b0;
  value_04.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_2a0;
  ::wasm::Builder::makeExport((Builder *)&local_288,(Name)local_298,value_04,Table);
  ::wasm::Module::addExport((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_288);
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  local_2e0 = (string_view)::wasm::Name::fromInt(0);
  ::wasm::Address::Address(&local_2e8,1);
  ::wasm::Address::Address((Address *)local_2f0,2);
  ::wasm::Type::Type(&local_2f8,i32);
  name_04.super_IString.str._M_str = (char *)local_2e0._M_len;
  name_04.super_IString.str._M_len = (size_t)&local_2d0;
  ::wasm::Builder::makeMemory(name_04,(Address)local_2e0._M_str,local_2e8,local_2f0[0],(Type)0x0);
  pNVar3 = (Name *)::wasm::Module::addMemory((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_2d0);
  local_2c8 = pNVar3;
  peVar1 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_20);
  ::wasm::Name::Name((Name *)&local_310,"memory");
  std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
            ((variant<wasm::Name,wasm::HeapType> *)
             ((long)&mod.
                     super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
             + 0x28),local_2c8);
  value_05.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_str = (char *)uStack_320;
  value_05.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
  str._M_len = mod.
               super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
               super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
               .
               super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
               .
               super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
               .
               super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
               .
               super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
               ._40_8_;
  value_05.super__Variant_base<wasm::Name,_wasm::HeapType>.
  super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
  super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
  super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_318;
  ::wasm::Builder::makeExport((Builder *)&local_300,(Name)local_310,value_05,Memory);
  ::wasm::Module::addExport((unique_ptr *)peVar1);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_300);
  this_00 = (variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>> *)
            ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>::
  variant<std::shared_ptr<wasm::Module>,void,void,std::shared_ptr<wasm::Module>,void>
            (this_00,(shared_ptr<wasm::Module> *)local_20);
  addModule((Result<wasm::Ok> *)&registration.name.super_IString.str._M_str,this,
            (WASTModule *)this_00);
  pEVar4 = ::wasm::Result<wasm::Ok>::getErr
                     ((Result<wasm::Ok> *)&registration.name.super_IString.str._M_str);
  if (pEVar4 != (Err *)0x0) {
    ::wasm::handle_unreachable
              ("error building spectest module",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
               ,499);
  }
  ::wasm::Name::Name((Name *)((long)&registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),"spectest")
  ;
  addRegistration((Result<wasm::Ok> *)local_3b8,this,
                  (Register *)
                  ((long)&registered.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  pEVar4 = ::wasm::Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_3b8);
  if (pEVar4 != (Err *)0x0) {
    ::wasm::handle_unreachable
              ("error registering spectest module",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
               ,0x1f8);
  }
  ::wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_3b8);
  ::wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&registration.name.super_IString.str._M_str)
  ;
  std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::~variant
            ((variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_> *)
             ((long)&added.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  std::shared_ptr<wasm::Module>::~shared_ptr((shared_ptr<wasm::Module> *)local_20);
  return;
}

Assistant:

void buildSpectestModule() {
    auto spectest = std::make_shared<Module>();
    spectest->features = FeatureSet::All;
    Builder builder(*spectest);

    spectest->addGlobal(builder.makeGlobal(Name::fromInt(0),
                                           Type::i32,
                                           builder.makeConst<uint32_t>(666),
                                           Builder::Immutable));
    spectest->addGlobal(builder.makeGlobal(Name::fromInt(1),
                                           Type::i64,
                                           builder.makeConst<uint64_t>(666),
                                           Builder::Immutable));
    spectest->addGlobal(builder.makeGlobal(Name::fromInt(2),
                                           Type::f32,
                                           builder.makeConst<float>(666.6f),
                                           Builder::Immutable));
    spectest->addGlobal(builder.makeGlobal(Name::fromInt(3),
                                           Type::f64,
                                           builder.makeConst<double>(666.6),
                                           Builder::Immutable));
    spectest->addExport(
      builder.makeExport("global_i32", Name::fromInt(0), ExternalKind::Global));
    spectest->addExport(
      builder.makeExport("global_i64", Name::fromInt(1), ExternalKind::Global));
    spectest->addExport(
      builder.makeExport("global_f32", Name::fromInt(2), ExternalKind::Global));
    spectest->addExport(
      builder.makeExport("global_f64", Name::fromInt(3), ExternalKind::Global));

    spectest->addTable(builder.makeTable(
      Name::fromInt(0), Type(HeapType::func, Nullable), 10, 20));
    spectest->addExport(
      builder.makeExport("table", Name::fromInt(0), ExternalKind::Table));

    spectest->addTable(builder.makeTable(
      Name::fromInt(1), Type(HeapType::func, Nullable), 10, 20, Type::i64));
    spectest->addExport(
      builder.makeExport("table64", Name::fromInt(1), ExternalKind::Table));

    Memory* memory =
      spectest->addMemory(builder.makeMemory(Name::fromInt(0), 1, 2));
    spectest->addExport(
      builder.makeExport("memory", memory->name, ExternalKind::Memory));

    // print_* functions are handled separately, no need to define here.

    WASTModule mod = std::move(spectest);
    auto added = addModule(mod);
    if (added.getErr()) {
      WASM_UNREACHABLE("error building spectest module");
    }
    Register registration{"spectest"};
    auto registered = addRegistration(registration);
    if (registered.getErr()) {
      WASM_UNREACHABLE("error registering spectest module");
    }
  }